

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void OPL_CALC_RH(FM_OPL *OPL,OPL_CH *CH,uint noise)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  OPL->phase_modulation = 0;
  iVar8 = CH[6].SLOT[0].op1_out[1];
  uVar2 = (CH[6].SLOT[0].AMmask & OPL->LFO_AM) + CH[6].SLOT[0].volume + CH[6].SLOT[0].TLL;
  iVar7 = CH[6].SLOT[0].op1_out[0];
  CH[6].SLOT[0].op1_out[0] = iVar8;
  if (CH[6].SLOT[0].CON == '\0') {
    OPL->phase_modulation = iVar8;
  }
  CH[6].SLOT[0].op1_out[1] = 0;
  if (uVar2 < 0x180) {
    bVar1 = CH[6].SLOT[0].FB;
    iVar6 = 0;
    iVar8 = iVar7 + iVar8;
    if (bVar1 == 0) {
      iVar8 = iVar6;
    }
    uVar2 = uVar2 * 0x10 +
            sin_tab[((CH[6].SLOT[0].Cnt & 0x3ff0000) + (iVar8 << (bVar1 & 0x1f)) >> 0x10 & 0x3ff) +
                    (uint)CH[6].SLOT[0].wavetable];
    if (uVar2 < 0x1800) {
      iVar6 = tl_tab[uVar2];
    }
    CH[6].SLOT[0].op1_out[1] = iVar6;
  }
  uVar2 = OPL->LFO_AM;
  uVar3 = (CH[6].SLOT[1].AMmask & uVar2) + CH[6].SLOT[1].volume + CH[6].SLOT[1].TLL;
  if ((uVar3 < 0x180) && (OPL->MuteSpc[0] == '\0')) {
    uVar3 = uVar3 * 0x10 +
            sin_tab[((uint)*(ushort *)((long)&CH[6].SLOT[1].Cnt + 2) + OPL->phase_modulation & 0x3ff
                    ) + (uint)CH[6].SLOT[1].wavetable];
    iVar8 = 0;
    if (uVar3 < 0x1800) {
      iVar8 = tl_tab[uVar3] * 2;
    }
    OPL->output[0] = OPL->output[0] + iVar8;
  }
  uVar3 = (OPL->P_CH[7].SLOT[0].AMmask & uVar2) +
          OPL->P_CH[7].SLOT[0].volume + OPL->P_CH[7].SLOT[0].TLL;
  if ((uVar3 < 0x180) && (OPL->MuteSpc[4] == '\0')) {
    uVar4 = OPL->P_CH[7].SLOT[0].Cnt;
    uVar5 = OPL->P_CH[8].SLOT[1].Cnt;
    uVar4 = uVar5 >> 0x15 ^ uVar5 >> 0x13 | uVar4 >> 0x13 | uVar4 >> 0x17 ^ uVar4 >> 0x12;
    iVar8 = 0x234;
    if ((uVar4 & 1) == 0) {
      iVar8 = 0xd0;
    }
    iVar7 = 0x2d0;
    if (noise == 0) {
      iVar7 = iVar8;
    }
    iVar6 = 0x34;
    if (noise == 0) {
      iVar6 = iVar8;
    }
    if ((uVar4 & 1) != 0) {
      iVar6 = iVar7;
    }
    uVar3 = uVar3 * 0x10 + sin_tab[(uint)OPL->P_CH[7].SLOT[0].wavetable + iVar6];
    iVar8 = 0;
    if (uVar3 < 0x1800) {
      iVar8 = tl_tab[uVar3] * 2;
    }
    OPL->output[0] = OPL->output[0] + iVar8;
  }
  uVar3 = (OPL->P_CH[7].SLOT[1].AMmask & uVar2) +
          OPL->P_CH[7].SLOT[1].volume + OPL->P_CH[7].SLOT[1].TLL;
  if ((uVar3 < 0x180) && (OPL->MuteSpc[1] == '\0')) {
    uVar5 = (*(byte *)((long)&OPL->P_CH[7].SLOT[0].Cnt + 3) & 1) * 0x100 + 0x100;
    uVar4 = uVar5 ^ 0x100;
    if (noise == 0) {
      uVar4 = uVar5;
    }
    uVar3 = uVar3 * 0x10 + sin_tab[OPL->P_CH[7].SLOT[1].wavetable + uVar4];
    iVar8 = 0;
    if (uVar3 < 0x1800) {
      iVar8 = tl_tab[uVar3] * 2;
    }
    OPL->output[0] = OPL->output[0] + iVar8;
  }
  uVar3 = (OPL->P_CH[8].SLOT[0].AMmask & uVar2) +
          OPL->P_CH[8].SLOT[0].volume + OPL->P_CH[8].SLOT[0].TLL;
  if ((uVar3 < 0x180) && (OPL->MuteSpc[2] == '\0')) {
    uVar3 = uVar3 * 0x10 +
            sin_tab[(*(ushort *)((long)&OPL->P_CH[8].SLOT[0].Cnt + 2) & 0x3ff) +
                    (uint)OPL->P_CH[8].SLOT[0].wavetable];
    iVar8 = 0;
    if (uVar3 < 0x1800) {
      iVar8 = tl_tab[uVar3] * 2;
    }
    OPL->output[0] = OPL->output[0] + iVar8;
  }
  uVar2 = (uVar2 & OPL->P_CH[8].SLOT[1].AMmask) +
          OPL->P_CH[8].SLOT[1].volume + OPL->P_CH[8].SLOT[1].TLL;
  if ((uVar2 < 0x180) && (OPL->MuteSpc[3] == '\0')) {
    uVar3 = OPL->P_CH[7].SLOT[0].Cnt;
    uVar4 = OPL->P_CH[8].SLOT[1].Cnt;
    uVar2 = uVar2 * 0x10 +
            sin_tab[(ulong)(((uVar4 >> 0x15 ^ uVar4 >> 0x13 |
                             uVar3 >> 0x13 | uVar3 >> 0x17 ^ uVar3 >> 0x12) & 1) * 0x200 +
                           (uint)OPL->P_CH[8].SLOT[1].wavetable) + 0x100];
    iVar8 = 0;
    if (uVar2 < 0x1800) {
      iVar8 = tl_tab[uVar2] * 2;
    }
    OPL->output[0] = OPL->output[0] + iVar8;
    return;
  }
  return;
}

Assistant:

INLINE void OPL_CALC_RH( FM_OPL *OPL, OPL_CH *CH, unsigned int noise )
{
	OPL_SLOT *SLOT;
	signed int out;
	unsigned int env;


	/* Bass Drum (verified on real YM3812):
	  - depends on the channel 6 'connect' register:
	      when connect = 0 it works the same as in normal (non-rhythm) mode (op1->op2->out)
	      when connect = 1 _only_ operator 2 is present on output (op2->out), operator 1 is ignored
	  - output sample always is multiplied by 2
	*/

	OPL->phase_modulation = 0;
	/* SLOT 1 */
	SLOT = &CH[6].SLOT[SLOT1];
	env = volume_calc(SLOT);

	out = SLOT->op1_out[0] + SLOT->op1_out[1];
	SLOT->op1_out[0] = SLOT->op1_out[1];

	if (!SLOT->CON)
		OPL->phase_modulation = SLOT->op1_out[0];
	/* else ignore output of operator 1 */

	SLOT->op1_out[1] = 0;
	if( env < ENV_QUIET )
	{
		if (!SLOT->FB)
			out = 0;
		SLOT->op1_out[1] = op_calc1(SLOT->Cnt, env, (out<<SLOT->FB), SLOT->wavetable );
	}

	/* SLOT 2 */
	SLOT++;
	env = volume_calc(SLOT);
	if( env < ENV_QUIET && ! OPL->MuteSpc[0] )
		OPL->output[0] += op_calc(SLOT->Cnt, env, OPL->phase_modulation, SLOT->wavetable) * 2;


	/* Phase generation is based on: */
	/* HH  (13) channel 7->slot 1 combined with channel 8->slot 2 (same combination as TOP CYMBAL but different output phases) */
	/* SD  (16) channel 7->slot 1 */
	/* TOM (14) channel 8->slot 1 */
	/* TOP (17) channel 7->slot 1 combined with channel 8->slot 2 (same combination as HIGH HAT but different output phases) */

	/* Envelope generation based on: */
	/* HH  channel 7->slot1 */
	/* SD  channel 7->slot2 */
	/* TOM channel 8->slot1 */
	/* TOP channel 8->slot2 */


	/* The following formulas can be well optimized.
	   I leave them in direct form for now (in case I've missed something).
	*/

	/* High Hat (verified on real YM3812) */
	env = volume_calc(SLOT7_1);
	if( env < ENV_QUIET && ! OPL->MuteSpc[4] )
	{
		/* high hat phase generation:
		    phase = d0 or 234 (based on frequency only)
		    phase = 34 or 2d0 (based on noise)
		*/

		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit7 = ((SLOT7_1->Cnt>>FREQ_SH)>>7)&1;
		unsigned char bit3 = ((SLOT7_1->Cnt>>FREQ_SH)>>3)&1;
		unsigned char bit2 = ((SLOT7_1->Cnt>>FREQ_SH)>>2)&1;

		unsigned char res1 = (bit2 ^ bit7) | bit3;

		/* when res1 = 0 phase = 0x000 | 0xd0; */
		/* when res1 = 1 phase = 0x200 | (0xd0>>2); */
		UINT32 phase = res1 ? (0x200|(0xd0>>2)) : 0xd0;

		/* enable gate based on frequency of operator 2 in channel 8 */
		unsigned char bit5e= ((SLOT8_2->Cnt>>FREQ_SH)>>5)&1;
		unsigned char bit3e= ((SLOT8_2->Cnt>>FREQ_SH)>>3)&1;

		unsigned char res2 = (bit3e ^ bit5e);

		/* when res2 = 0 pass the phase from calculation above (res1); */
		/* when res2 = 1 phase = 0x200 | (0xd0>>2); */
		if (res2)
			phase = (0x200|(0xd0>>2));


		/* when phase & 0x200 is set and noise=1 then phase = 0x200|0xd0 */
		/* when phase & 0x200 is set and noise=0 then phase = 0x200|(0xd0>>2), ie no change */
		if (phase&0x200)
		{
			if (noise)
				phase = 0x200|0xd0;
		}
		else
		/* when phase & 0x200 is clear and noise=1 then phase = 0xd0>>2 */
		/* when phase & 0x200 is clear and noise=0 then phase = 0xd0, ie no change */
		{
			if (noise)
				phase = 0xd0>>2;
		}

		OPL->output[0] += op_calc(phase<<FREQ_SH, env, 0, SLOT7_1->wavetable) * 2;
	}

	/* Snare Drum (verified on real YM3812) */
	env = volume_calc(SLOT7_2);
	if( env < ENV_QUIET && ! OPL->MuteSpc[1] )
	{
		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit8 = ((SLOT7_1->Cnt>>FREQ_SH)>>8)&1;

		/* when bit8 = 0 phase = 0x100; */
		/* when bit8 = 1 phase = 0x200; */
		UINT32 phase = bit8 ? 0x200 : 0x100;

		/* Noise bit XOR'es phase by 0x100 */
		/* when noisebit = 0 pass the phase from calculation above */
		/* when noisebit = 1 phase ^= 0x100; */
		/* in other words: phase ^= (noisebit<<8); */
		if (noise)
			phase ^= 0x100;

		OPL->output[0] += op_calc(phase<<FREQ_SH, env, 0, SLOT7_2->wavetable) * 2;
	}

	/* Tom Tom (verified on real YM3812) */
	env = volume_calc(SLOT8_1);
	if( env < ENV_QUIET && ! OPL->MuteSpc[2] )
		OPL->output[0] += op_calc(SLOT8_1->Cnt, env, 0, SLOT8_1->wavetable) * 2;

	/* Top Cymbal (verified on real YM3812) */
	env = volume_calc(SLOT8_2);
	if( env < ENV_QUIET && ! OPL->MuteSpc[3] )
	{
		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit7 = ((SLOT7_1->Cnt>>FREQ_SH)>>7)&1;
		unsigned char bit3 = ((SLOT7_1->Cnt>>FREQ_SH)>>3)&1;
		unsigned char bit2 = ((SLOT7_1->Cnt>>FREQ_SH)>>2)&1;

		unsigned char res1 = (bit2 ^ bit7) | bit3;

		/* when res1 = 0 phase = 0x000 | 0x100; */
		/* when res1 = 1 phase = 0x200 | 0x100; */
		UINT32 phase = res1 ? 0x300 : 0x100;

		/* enable gate based on frequency of operator 2 in channel 8 */
		unsigned char bit5e= ((SLOT8_2->Cnt>>FREQ_SH)>>5)&1;
		unsigned char bit3e= ((SLOT8_2->Cnt>>FREQ_SH)>>3)&1;

		unsigned char res2 = (bit3e ^ bit5e);
		/* when res2 = 0 pass the phase from calculation above (res1); */
		/* when res2 = 1 phase = 0x200 | 0x100; */
		if (res2)
			phase = 0x300;

		OPL->output[0] += op_calc(phase<<FREQ_SH, env, 0, SLOT8_2->wavetable) * 2;
	}
}